

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

BytesToSend * __thiscall
V1Transport::GetBytesToSend_abi_cxx11_
          (BytesToSend *__return_storage_ptr__,V1Transport *this,bool have_next_message)

{
  size_t sVar1;
  pointer puVar2;
  pointer puVar3;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock40;
  unique_lock<std::mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&local_30,&this->m_send_mutex,"m_send_mutex"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
             ,0x349,false);
  sVar1 = this->m_bytes_sent;
  if (this->m_sending_header == true) {
    puVar2 = (this->m_header_to_send).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (this->m_header_to_send).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish + (-(long)puVar2 - sVar1);
    have_next_message =
         have_next_message ||
         (this->m_message_to_send).data.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start !=
         (this->m_message_to_send).data.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    puVar2 = (this->m_message_to_send).data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (this->m_message_to_send).data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish + (-(long)puVar2 - sVar1);
  }
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_Span<const_unsigned_char>,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ).
  super__Tuple_impl<1UL,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .
  super__Tuple_impl<2UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .
  super__Head_base<2UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
  ._M_head_impl = &(this->m_message_to_send).m_type;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_Span<const_unsigned_char>,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ).
  super__Tuple_impl<1UL,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .super__Head_base<1UL,_bool,_false>._M_head_impl = have_next_message;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_Span<const_unsigned_char>,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ).super__Head_base<0UL,_Span<const_unsigned_char>,_false>._M_head_impl.m_data = puVar2 + sVar1;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_Span<const_unsigned_char>,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ).super__Head_base<0UL,_Span<const_unsigned_char>,_false>._M_head_impl.m_size = (size_t)puVar3;
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

Transport::BytesToSend V1Transport::GetBytesToSend(bool have_next_message) const noexcept
{
    AssertLockNotHeld(m_send_mutex);
    LOCK(m_send_mutex);
    if (m_sending_header) {
        return {Span{m_header_to_send}.subspan(m_bytes_sent),
                // We have more to send after the header if the message has payload, or if there
                // is a next message after that.
                have_next_message || !m_message_to_send.data.empty(),
                m_message_to_send.m_type
               };
    } else {
        return {Span{m_message_to_send.data}.subspan(m_bytes_sent),
                // We only have more to send after this message's payload if there is another
                // message.
                have_next_message,
                m_message_to_send.m_type
               };
    }
}